

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaDump(FILE *output,xmlSchemaPtr schema)

{
  xmlSchemaPtr schema_local;
  FILE *output_local;
  
  if (output != (FILE *)0x0) {
    if (schema == (xmlSchemaPtr)0x0) {
      fprintf((FILE *)output,"Schemas: NULL\n");
    }
    else {
      fprintf((FILE *)output,"Schemas: ");
      if (schema->name == (xmlChar *)0x0) {
        fprintf((FILE *)output,"no name, ");
      }
      else {
        fprintf((FILE *)output,"%s, ",schema->name);
      }
      if (schema->targetNamespace == (xmlChar *)0x0) {
        fprintf((FILE *)output,"no target namespace");
      }
      else {
        fprintf((FILE *)output,"%s",schema->targetNamespace);
      }
      fprintf((FILE *)output,"\n");
      if (schema->annot != (xmlSchemaAnnotPtr)0x0) {
        xmlSchemaAnnotDump(output,schema->annot);
      }
      xmlHashScan(schema->typeDecl,xmlSchemaTypeDumpEntry,output);
      xmlHashScanFull(schema->elemDecl,xmlSchemaElementDump,output);
    }
  }
  return;
}

Assistant:

void
xmlSchemaDump(FILE * output, xmlSchemaPtr schema)
{
    if (output == NULL)
        return;
    if (schema == NULL) {
        fprintf(output, "Schemas: NULL\n");
        return;
    }
    fprintf(output, "Schemas: ");
    if (schema->name != NULL)
        fprintf(output, "%s, ", schema->name);
    else
        fprintf(output, "no name, ");
    if (schema->targetNamespace != NULL)
        fprintf(output, "%s", (const char *) schema->targetNamespace);
    else
        fprintf(output, "no target namespace");
    fprintf(output, "\n");
    if (schema->annot != NULL)
        xmlSchemaAnnotDump(output, schema->annot);
    xmlHashScan(schema->typeDecl, xmlSchemaTypeDumpEntry, output);
    xmlHashScanFull(schema->elemDecl, xmlSchemaElementDump, output);
}